

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

string * __thiscall
juzzlin::SimpleLogger::Impl::currentDateTime
          (Impl *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          now,string *dateTimeFormat)

{
  tm *__tmb;
  char *__fmt;
  string *in_RDI;
  time_t rawTime;
  ostringstream oss;
  time_point *in_stack_fffffffffffffe40;
  time_t local_1a0;
  ostringstream local_198 [136];
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  _Put_time<char> in_stack_fffffffffffffef8;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a0 = std::chrono::_V2::system_clock::to_time_t(in_stack_fffffffffffffe40);
  __tmb = localtime(&local_1a0);
  __fmt = (char *)std::__cxx11::string::c_str();
  std::put_time<char>((tm *)__tmb,__fmt);
  std::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SimpleLogger::Impl::currentDateTime(std::chrono::time_point<std::chrono::system_clock> now, const std::string & dateTimeFormat) const
{
    std::ostringstream oss;
    const auto rawTime = std::chrono::system_clock::to_time_t(now);
    oss << std::put_time(std::localtime(&rawTime), dateTimeFormat.c_str());

    return oss.str();
}